

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

bool __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::is_new_line
          (input_stream_t<cfgfile::string_trait_t> *this,char_t *ch)

{
  char_t cVar1;
  input_stream_t<cfgfile::string_trait_t> *in_RSI;
  value_type *in_RDI;
  char_t next_char;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  if (*(char *)&in_RSI->m_stream == const_t<cfgfile::string_trait_t>::c_carriage_return) {
    local_1 = true;
  }
  else if (*(char *)&in_RSI->m_stream == const_t<cfgfile::string_trait_t>::c_line_feed) {
    cVar1 = simple_get(in_RSI);
    if (cVar1 == const_t<cfgfile::string_trait_t>::c_carriage_return) {
      *(char_t *)&in_RSI->m_stream = cVar1;
      local_1 = true;
    }
    else {
      std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)
                 CONCAT17(cVar1,in_stack_ffffffffffffffe0),in_RDI);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_new_line( typename Trait::char_t & ch )
	{
		if( ch == const_t< Trait >::c_carriage_return )
			return true;
		else if( ch == const_t< Trait >::c_line_feed )
		{
			typename Trait::char_t next_char( 0x00 );

			next_char = simple_get();

			if( next_char == const_t< Trait >::c_carriage_return )
			{
				ch = next_char;

				return true;
			}
			else
			{
				m_returned_char.push( next_char );

				return true;
			}
		}
		else
			return false;
	}